

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.cpp
# Opt level: O0

ValueFederate * __thiscall helics::ValueFederate::operator=(ValueFederate *this,ValueFederate *fed)

{
  bool bVar1;
  LocalFederateId id;
  long *in_RSI;
  ValueFederate *in_RDI;
  Federate *unaff_retaddr;
  unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
  *in_stack_ffffffffffffffd8;
  LocalFederateId local_14;
  long *local_10;
  ValueFederate *fed_00;
  
  local_10 = in_RSI;
  fed_00 = in_RDI;
  std::unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
  ::operator=((unique_ptr<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
               *)in_RDI,in_stack_ffffffffffffffd8);
  local_14 = Federate::getID((Federate *)
                             ((long)&in_RDI->_vptr_ValueFederate +
                             (long)in_RDI->_vptr_ValueFederate[-3]));
  id = Federate::getID((Federate *)((long)local_10 + *(long *)(*local_10 + -0x18)));
  bVar1 = LocalFederateId::operator!=(&local_14,id);
  if (bVar1) {
    Federate::operator=(unaff_retaddr,(Federate *)fed_00);
  }
  return in_RDI;
}

Assistant:

ValueFederate& ValueFederate::operator=(ValueFederate&& fed) noexcept
{
    vfManager = std::move(fed.vfManager);
    if (getID() != fed.getID()) {  // the id won't be moved, as it is copied so use it as a test if
                                   // it has moved already
        Federate::operator=(std::move(fed));
    }
    return *this;
}